

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICMakeFiles.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_123021a::CMakeFiles::DumpInputs(Value *__return_storage_ptr__,CMakeFiles *this)

{
  bool bVar1;
  cmake *this_00;
  cmGlobalGenerator *this_01;
  LocalGeneratorVector *this_02;
  reference this_03;
  pointer this_04;
  cmMakefile *this_05;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_06;
  Value local_a8;
  reference local_80;
  string *file;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmMakefile *mf;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg;
  const_iterator __end1;
  const_iterator __begin1;
  LocalGeneratorVector *__range1;
  cmGlobalGenerator *gg;
  CMakeFiles *this_local;
  Value *inputs;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  this_00 = cmFileAPI::GetCMakeInstance(this->FileAPI);
  this_01 = cmake::GetGlobalGenerator(this_00);
  this_02 = cmGlobalGenerator::GetLocalGenerators(this_01);
  __end1 = std::
           vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ::begin(this_02);
  lg = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
       std::
       vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
       ::end(this_02);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                     *)&lg), bVar1) {
    this_03 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
              ::operator*(&__end1);
    this_04 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                        (this_03);
    this_05 = cmLocalGenerator::GetMakefile(this_04);
    this_06 = cmMakefile::GetListFiles_abi_cxx11_(this_05);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_06);
    file = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_06);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&file), bVar1) {
      local_80 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      DumpInput(&local_a8,this,local_80);
      Json::Value::append(__return_storage_ptr__,&local_a8);
      Json::Value::~Value(&local_a8);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value CMakeFiles::DumpInputs()
{
  Json::Value inputs = Json::arrayValue;

  cmGlobalGenerator* gg =
    this->FileAPI.GetCMakeInstance()->GetGlobalGenerator();
  for (const auto& lg : gg->GetLocalGenerators()) {
    cmMakefile const* mf = lg->GetMakefile();
    for (std::string const& file : mf->GetListFiles()) {
      inputs.append(this->DumpInput(file));
    }
  }

  return inputs;
}